

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboUtil.cpp
# Opt level: O0

ostream * deqp::gls::FboUtil::operator<<(ostream *stream,ImageFormat *format)

{
  ostream *poVar1;
  Enum<int,_2UL> EVar2;
  Enum<int,_2UL> local_70;
  GetNameFunc local_60;
  int local_58;
  Enum<int,_2UL> local_50;
  GetNameFunc local_40;
  int local_38;
  Enum<int,_2UL> local_30;
  ImageFormat *local_20;
  ImageFormat *format_local;
  ostream *stream_local;
  
  local_20 = format;
  format_local = (ImageFormat *)stream;
  if (format->unsizedType == 0) {
    EVar2 = glu::getTextureFormatStr(format->format);
    local_40 = EVar2.m_getName;
    local_38 = EVar2.m_value;
    local_30.m_getName = local_40;
    local_30.m_value = local_38;
    stream_local = tcu::Format::operator<<(stream,&local_30);
  }
  else {
    poVar1 = std::operator<<(stream,"(format = ");
    EVar2 = glu::getTextureFormatStr(local_20->format);
    local_60 = EVar2.m_getName;
    local_58 = EVar2.m_value;
    local_50.m_getName = local_60;
    local_50.m_value = local_58;
    poVar1 = tcu::Format::operator<<(poVar1,&local_50);
    poVar1 = std::operator<<(poVar1,", type = ");
    EVar2 = glu::getTypeStr(local_20->unsizedType);
    local_70.m_getName = EVar2.m_getName;
    local_70.m_value = EVar2.m_value;
    poVar1 = tcu::Format::operator<<(poVar1,&local_70);
    stream_local = std::operator<<(poVar1,")");
  }
  return stream_local;
}

Assistant:

std::ostream& operator<< (std::ostream& stream, const ImageFormat& format)
{
	if (format.unsizedType == GL_NONE)
	{
		// sized format
		return stream << glu::getTextureFormatStr(format.format);
	}
	else
	{
		// unsized format
		return stream << "(format = " << glu::getTextureFormatStr(format.format) << ", type = " << glu::getTypeStr(format.unsizedType) << ")";
	}
}